

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcPrsGramNode * __thiscall CTcPrsGramNodeCat::clone_expansion(CTcPrsGramNodeCat *this)

{
  CTcTokenSource *pCVar1;
  int iVar2;
  CTcPrsGramNode *pCVar3;
  undefined4 extraout_var;
  CTcPrsGramNode *pCVar5;
  CTcPrsGramNode *pCVar6;
  CTcTokenSource *pCVar4;
  
  pCVar3 = (CTcPrsGramNode *)CTcPrsMem::alloc(G_prsmem,0x58);
  (pCVar3->super_CTcTokenSource)._vptr_CTcTokenSource = (_func_int **)0x0;
  (pCVar3->super_CTcTokenSource).enclosing_src_ = (CTcTokenSource *)0x0;
  *(undefined8 *)&(pCVar3->super_CTcTokenSource).enclosing_curtok_ = 0;
  (pCVar3->super_CTcTokenSource).enclosing_curtok_.text_ = (char *)0x0;
  (pCVar3->super_CTcTokenSource).enclosing_curtok_.text_len_ = 0;
  (pCVar3->super_CTcTokenSource).enclosing_curtok_.int_val_ = 0;
  *(undefined8 *)&(pCVar3->super_CTcTokenSource).enclosing_curtok_.field_0x20 = 0;
  pCVar3->next_ = (CTcPrsGramNode *)0x0;
  pCVar3[1].super_CTcTokenSource._vptr_CTcTokenSource = (_func_int **)0x0;
  pCVar3[1].super_CTcTokenSource.enclosing_src_ = (CTcTokenSource *)0x0;
  *(undefined8 *)&pCVar3[1].super_CTcTokenSource.enclosing_curtok_ = 0;
  (pCVar3->super_CTcTokenSource)._vptr_CTcTokenSource = (_func_int **)&PTR__CTcTokenSource_0031b4b0;
  pCVar6 = (this->super_CTcPrsGramNodeWithChildren).sub_head_;
  if (pCVar6 != (CTcPrsGramNode *)0x0) {
    do {
      iVar2 = (*(pCVar6->super_CTcTokenSource)._vptr_CTcTokenSource[10])(pCVar6);
      pCVar4 = (CTcTokenSource *)CONCAT44(extraout_var,iVar2);
      pCVar1 = pCVar3[1].super_CTcTokenSource.enclosing_src_;
      pCVar5 = (CTcPrsGramNode *)(pCVar1 + 1);
      if (pCVar1 == (CTcTokenSource *)0x0) {
        pCVar5 = pCVar3 + 1;
      }
      (pCVar5->super_CTcTokenSource)._vptr_CTcTokenSource = (_func_int **)pCVar4;
      pCVar3[1].super_CTcTokenSource.enclosing_src_ = pCVar4;
      pCVar4[1]._vptr_CTcTokenSource = (_func_int **)0x0;
      pCVar6 = pCVar6->next_;
    } while (pCVar6 != (CTcPrsGramNode *)0x0);
  }
  return pCVar3;
}

Assistant:

virtual CTcPrsGramNode *clone_expansion() const
    {
        /* create a new 'cat' node */
        CTcPrsGramNodeCat *new_cat = new (G_prsmem) CTcPrsGramNodeCat();

        /* add a clone of each of my children and add it to my replica */
        for (CTcPrsGramNode *cur = sub_head_ ; cur != 0 ; cur = cur->next_)
            new_cat->add_sub_item(cur->clone_expansion());

        /* return my replica */
        return new_cat;
    }